

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<float>::Clear
          (RepeatedFieldWrapper<float> *this,Field *data)

{
  RepeatedField<float> *this_00;
  Field *data_local;
  RepeatedFieldWrapper<float> *this_local;
  
  this_00 = (RepeatedField<float> *)(**(code **)(*(long *)this + 0x88))(this,data);
  RepeatedField<float>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }